

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

ParamSpec * __thiscall caffe::ParamSpec::New(ParamSpec *this,Arena *arena)

{
  ParamSpec *this_00;
  
  this_00 = (ParamSpec *)operator_new(0x30);
  ParamSpec(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::ParamSpec>(arena,this_00);
  }
  return this_00;
}

Assistant:

ParamSpec* ParamSpec::New(::google::protobuf::Arena* arena) const {
  ParamSpec* n = new ParamSpec;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}